

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cryptohelper_test.cpp
# Opt level: O0

void __thiscall test::test_load_and_sign::test_method(test_load_and_sign *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  pointer pCVar3;
  long lVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_160;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[24],_const_char_(&)[24]> local_150;
  assertion_result local_130;
  basic_cstring<const_char> local_118;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]> local_e8;
  assertion_result local_c8;
  basic_cstring<const_char> local_b0;
  basic_cstring<const_char> local_a0;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  string signature;
  string local_38 [8];
  string pk_str;
  unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> crypto;
  test_load_and_sign *this_local;
  
  license::CryptoHelper::getInstance();
  loadPrivateKey_abi_cxx11_();
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)((long)&pk_str.field_2 + 8));
  (*pCVar3->_vptr_CryptoHelper[4])(pCVar3,local_38);
  pCVar3 = std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::
           operator->((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>
                       *)((long)&pk_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"testString",&local_89);
  (*pCVar3->_vptr_CryptoHelper[5])(local_68,pCVar3,local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x8c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_a0,0x65,&local_b0);
    lVar4 = std::__cxx11::string::size();
    boost::test_tools::assertion_result::assertion_result(&local_c8,lVar4 == 0xac);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e8,plVar5,(char (*) [28])"signature is the right size");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x8c);
    boost::test_tools::tt_detail::report_assertion(&local_c8,&local_e8,&local_f8,0x65,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[28],_const_char_(&)[28]>::
    ~lazy_ostream_impl(&local_e8);
    boost::test_tools::assertion_result::~assertion_result(&local_c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_108,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x8c);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_118);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_108,0x66,&local_118);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,
                            "0pBQSdgwE6amOQJ1T+byZhJetVl86OWLHC+ICJ/IENVoNqcJF2pDaoRuNtDEq5v/lqmQbQJg4d08VtRCen3Q3VuUrge2e7hQ3ktkkK8DwTtUJA+pcB540sofcdbXabF+L+vwmj5jUWsamJzp/fhg8xpQ72L54UzjcbKsGVgsc2Y="
                           );
    boost::test_tools::assertion_result::assertion_result(&local_130,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_150,plVar5,(char (*) [24])"signature is repeatable");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/extern/license-generator/test/cryptohelper_test.cpp"
               ,0x8c);
    boost::test_tools::tt_detail::report_assertion(&local_130,&local_150,&local_160,0x66,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[24],_const_char_(&)[24]>::
    ~lazy_ostream_impl(&local_150);
    boost::test_tools::assertion_result::~assertion_result(&local_130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::release
            ((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> *)
             ((long)&pk_str.field_2 + 8));
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_38);
  std::unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_>::~unique_ptr
            ((unique_ptr<license::CryptoHelper,_std::default_delete<license::CryptoHelper>_> *)
             ((long)&pk_str.field_2 + 8));
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_load_and_sign) {
	unique_ptr<CryptoHelper> crypto(CryptoHelper::getInstance());
	const std::string pk_str = loadPrivateKey();
	crypto->loadPrivateKey(pk_str);
	const std::string signature = crypto->signString("testString");
	BOOST_CHECK_MESSAGE(signature.size() == 172, "signature is the right size");
	BOOST_CHECK_MESSAGE(signature == SIGNATURE, "signature is repeatable");
	crypto.release();
}